

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_address.c
# Opt level: O0

void load_address(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ushort *in_RSI;
  long in_RDI;
  uint16_t offset;
  load_address_t *instr;
  uint32_t in_stack_ffffffffffffff3c;
  arm7tdmi_t *in_stack_ffffffffffffff40;
  int local_40;
  
  uVar1 = (*in_RSI & 0xff) << 2;
  if ((*in_RSI >> 0xb & 1) == 0) {
    uVar3 = (*(uint *)(in_RDI + 0xb0) & 0xfffffffd) + (uint)uVar1;
    uVar2 = (uint)(*in_RSI >> 8 & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar3);
    }
    if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      *(uint *)(in_RDI + 0x6c + (ulong)(uVar2 - 8) * 4) = uVar3;
    }
    else if (uVar2 < 0xd) {
      *(uint *)(in_RDI + 0x38 + (ulong)uVar2 * 4) = uVar3;
    }
    else if (uVar2 == 0xd) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)(in_RDI + 0x84) = uVar3;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x90) = uVar3;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x88) = uVar3;
        break;
      default:
        *(uint *)(in_RDI + 0x80) = uVar3;
        break;
      case 0x17:
        *(uint *)(in_RDI + 0x8c) = uVar3;
        break;
      case 0x1b:
        *(uint *)(in_RDI + 0x94) = uVar3;
      }
    }
    else if (uVar2 == 0xe) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)(in_RDI + 0x9c) = uVar3;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0xa8) = uVar3;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0xa0) = uVar3;
        break;
      default:
        *(uint *)(in_RDI + 0x98) = uVar3;
        break;
      case 0x17:
        *(uint *)(in_RDI + 0xa4) = uVar3;
        break;
      case 0x1b:
        *(uint *)(in_RDI + 0xac) = uVar3;
      }
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      }
      else {
        set_pc(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      }
    }
  }
  else {
    uVar3 = *(byte *)((long)in_RSI + 1) & 7;
    switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_40 = *(int *)(in_RDI + 0x84);
      break;
    case 0x12:
      local_40 = *(int *)(in_RDI + 0x90);
      break;
    case 0x13:
      local_40 = *(int *)(in_RDI + 0x88);
      break;
    default:
      local_40 = *(int *)(in_RDI + 0x80);
      break;
    case 0x17:
      local_40 = *(int *)(in_RDI + 0x8c);
      break;
    case 0x1b:
      local_40 = *(int *)(in_RDI + 0x94);
    }
    uVar2 = local_40 + (uint)uVar1;
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar3,(ulong)uVar2);
    }
    if ((((*(uint *)(in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar3)) && (uVar3 < 0xd)) {
      *(uint *)(in_RDI + 0x6c + (ulong)(uVar3 - 8) * 4) = uVar2;
    }
    else if (uVar3 < 0xd) {
      *(uint *)(in_RDI + 0x38 + (ulong)uVar3 * 4) = uVar2;
    }
    else if (uVar3 == 0xd) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)(in_RDI + 0x84) = uVar2;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x90) = uVar2;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x88) = uVar2;
        break;
      default:
        *(uint *)(in_RDI + 0x80) = uVar2;
        break;
      case 0x17:
        *(uint *)(in_RDI + 0x8c) = uVar2;
        break;
      case 0x1b:
        *(uint *)(in_RDI + 0x94) = uVar2;
      }
    }
    else if (uVar3 == 0xe) {
      switch(*(uint *)(in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)(in_RDI + 0x9c) = uVar2;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0xa8) = uVar2;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0xa0) = uVar2;
        break;
      default:
        *(uint *)(in_RDI + 0x98) = uVar2;
        break;
      case 0x17:
        *(uint *)(in_RDI + 0xa4) = uVar2;
        break;
      case 0x1b:
        *(uint *)(in_RDI + 0xac) = uVar2;
      }
    }
    else {
      if (uVar3 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar3);
        exit(1);
      }
      if ((*(uint *)(in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      }
      else {
        set_pc(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      }
    }
  }
  return;
}

Assistant:

void load_address(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    load_address_t* instr = &thminstr->LOAD_ADDRESS;
    half offset = instr->word8 << 2;

    if (instr->sp) {
        set_register(state, instr->rd, get_sp(state) + offset);
    } else {
        set_register(state, instr->rd, (state->pc & 0xFFFFFFFD) + offset);
    }
}